

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddObjectDepends
          (cmComputeTargetDepends *this,size_t depender_index,cmSourceFile *o,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *this_00;
  cmake *this_01;
  TargetType TVar1;
  pair<std::_Rb_tree_iterator<cmLinkItem>,_bool> pVar2;
  allocator<char> local_119;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_118;
  undefined1 local_108 [16];
  string local_f8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  cmLinkItem local_88;
  
  cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)(local_108 + 0x10),o);
  if ((cmGlobalGenerator *)local_f8._M_string_length == (cmGlobalGenerator *)0x0) goto LAB_0048909d;
  this_00 = (this->Targets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start[depender_index];
  std::__cxx11::string::string((string *)&local_a8,(string *)(local_108 + 0x10));
  local_118.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_118.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_118);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_d8,&local_a8,(cmListFileBacktrace *)&local_118);
  cmGeneratorTarget::ResolveLinkItem(&local_88,this_00,&local_d8,&cmLinkItem::DEFAULT_abi_cxx11_);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_a8);
  pVar2 = std::
          _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
          ::_M_insert_unique<cmLinkItem_const&>
                    ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                      *)emitted,&local_88);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    TVar1 = cmGeneratorTarget::GetType(this_00);
    if (TVar1 != EXECUTABLE) {
      TVar1 = cmGeneratorTarget::GetType(this_00);
      if (TVar1 != STATIC_LIBRARY) {
        TVar1 = cmGeneratorTarget::GetType(this_00);
        if (TVar1 != SHARED_LIBRARY) {
          TVar1 = cmGeneratorTarget::GetType(this_00);
          if (TVar1 != MODULE_LIBRARY) {
            TVar1 = cmGeneratorTarget::GetType(this_00);
            if (TVar1 != OBJECT_LIBRARY) {
              this_01 = this->GlobalGenerator->CMakeInstance;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d8,
                         "Only executables and libraries may reference target objects.",&local_119);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_108);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_d8.Value,
                                  (cmListFileBacktrace *)local_108);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
              std::__cxx11::string::~string((string *)&local_d8);
              goto LAB_00489090;
            }
          }
        }
      }
    }
    cmTarget::AddUtility(this_00->Target,(string *)(local_108 + 0x10),false,(cmMakefile *)0x0);
  }
LAB_00489090:
  cmLinkItem::~cmLinkItem(&local_88);
LAB_0048909d:
  std::__cxx11::string::~string((string *)(local_108 + 0x10));
  return;
}

Assistant:

void cmComputeTargetDepends::AddObjectDepends(size_t depender_index,
                                              cmSourceFile const* o,
                                              std::set<cmLinkItem>& emitted)
{
  std::string const& objLib = o->GetObjectLibrary();
  if (objLib.empty()) {
    return;
  }
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmLinkItem const& objItem =
    depender->ResolveLinkItem(BT<std::string>(objLib));
  if (emitted.insert(objItem).second) {
    if (depender->GetType() != cmStateEnums::EXECUTABLE &&
        depender->GetType() != cmStateEnums::STATIC_LIBRARY &&
        depender->GetType() != cmStateEnums::SHARED_LIBRARY &&
        depender->GetType() != cmStateEnums::MODULE_LIBRARY &&
        depender->GetType() != cmStateEnums::OBJECT_LIBRARY) {
      this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Only executables and libraries may reference target objects.",
        depender->GetBacktrace());
      return;
    }
    const_cast<cmGeneratorTarget*>(depender)->Target->AddUtility(objLib,
                                                                 false);
  }
}